

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O2

void __thiscall Assimp::PlyExporter::WriteMeshIndices(PlyExporter *this,aiMesh *m,uint offset)

{
  aiFace *paVar1;
  ostream *poVar2;
  ulong uVar3;
  allocator<char> local_6d;
  uint local_6c;
  aiMesh *local_68;
  ulong local_60;
  string *local_58;
  string local_50 [32];
  
  local_58 = (string *)&this->endl;
  local_6c = offset;
  local_68 = m;
  for (local_60 = 0; local_60 < local_68->mNumFaces; local_60 = local_60 + 1) {
    paVar1 = local_68->mFaces + local_60;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
    std::operator<<(poVar2," ");
    for (uVar3 = 0; uVar3 < paVar1->mNumIndices; uVar3 = uVar3 + 1) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
      if (uVar3 == paVar1->mNumIndices - 1) {
        std::__cxx11::string::string(local_50,local_58);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>(local_50," ",&local_6d);
      }
      std::operator<<(poVar2,local_50);
      std::__cxx11::string::~string(local_50);
    }
  }
  return;
}

Assistant:

void PlyExporter::WriteMeshIndices(const aiMesh* m, unsigned int offset)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];
        mOutput << f.mNumIndices << " ";
        for(unsigned int c = 0; c < f.mNumIndices; ++c) {
            mOutput << (f.mIndices[c] + offset) << (c == f.mNumIndices-1 ? endl : " ");
        }
    }
}